

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_open(uv_udp_t *handle,uv_os_sock_t sock)

{
  int err;
  uv_os_sock_t sock_local;
  uv_udp_t *handle_local;
  
  if ((handle->io_watcher).fd == -1) {
    handle_local._4_4_ = uv__nonblock_ioctl(sock,1);
    if ((handle_local._4_4_ == 0) &&
       (handle_local._4_4_ = uv__set_reuse(sock), handle_local._4_4_ == 0)) {
      (handle->io_watcher).fd = sock;
      handle_local._4_4_ = 0;
    }
  }
  else {
    handle_local._4_4_ = -0x10;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_udp_open(uv_udp_t* handle, uv_os_sock_t sock) {
  int err;

  /* Check for already active socket. */
  if (handle->io_watcher.fd != -1)
    return -EBUSY;

  err = uv__nonblock(sock, 1);
  if (err)
    return err;

  err = uv__set_reuse(sock);
  if (err)
    return err;

  handle->io_watcher.fd = sock;
  return 0;
}